

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::ReferenceResolver::ReferenceResolver(ReferenceResolver *this,Tree *t_)

{
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *in_RSI;
  undefined8 *in_RDI;
  ReferenceResolver *in_stack_00000010;
  Callbacks *in_stack_ffffffffffffffe8;
  
  *in_RDI = in_RSI;
  Tree::callbacks((Tree *)in_RSI);
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::stack(in_RSI,in_stack_ffffffffffffffe8);
  resolve(in_stack_00000010);
  return;
}

Assistant:

ReferenceResolver(Tree *t_) : t(t_), refs(t_->callbacks())
    {
        resolve();
    }